

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_retcode.c
# Opt level: O2

void TA_SetRetCodeInfo(TA_RetCode theRetCode,TA_RetCodeInfo *retCodeInfo)

{
  long lVar1;
  char *pcVar2;
  long lVar3;
  
  if (theRetCode - TA_INTERNAL_ERROR < 1000) {
    retCodeInfo->enumStr = "TA_INTERNAL_ERROR";
    pcVar2 = "Unexpected Internal Error - Contact TA-Lib.org";
  }
  else {
    lVar1 = 0;
    do {
      lVar3 = lVar1;
      if (lVar3 + 0x18 == 0x1c8) {
        retCodeInfo->enumStr = "TA_UNKNOWN_ERR";
        pcVar2 = "Unknown Error";
        goto LAB_00188382;
      }
      lVar1 = lVar3 + 0x18;
    } while (*(TA_RetCode *)((long)&retCodeInfoTable[0].retCode + lVar3) != theRetCode);
    pcVar2 = *(char **)((long)&retCodeInfoTable[0].infoStr + lVar3);
    retCodeInfo->enumStr = *(char **)((long)&retCodeInfoTable[0].enumStr + lVar3);
  }
LAB_00188382:
  retCodeInfo->infoStr = pcVar2;
  return;
}

Assistant:

void TA_SetRetCodeInfo( TA_RetCode theRetCode, TA_RetCodeInfo *retCodeInfo )
{
   unsigned int i;

   /* Trap internal error code */
   if( (theRetCode >= 5000) && (theRetCode <= 5999) )
   {
      retCodeInfo->enumStr = "TA_INTERNAL_ERROR";
      retCodeInfo->infoStr = "Unexpected Internal Error - Contact TA-Lib.org";
      return;
   }

   /* Check among all the error code defined in ta_common.h */
   for( i=0; i < (NB_RET_CODE_INFO-1); i++ )
   {
      if( theRetCode == retCodeInfoTable[i].retCode )
      {
         /* Error code found. */
         retCodeInfo->enumStr = retCodeInfoTable[i].enumStr;
         retCodeInfo->infoStr = retCodeInfoTable[i].infoStr;
         return;
      }
   }

   /* Error code not found. */

   /* "TA_UNKNOWN_ERR" is ALWAYS the last entry in the table. */
   retCodeInfo->enumStr = retCodeInfoTable[i].enumStr;
   retCodeInfo->infoStr = retCodeInfoTable[i].infoStr;
}